

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O3

int run_test_udp_no_autobind(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_b_6;
  uv_udp_t h2;
  uv_udp_t h;
  undefined1 local_188 [16];
  uv_udp_t local_178;
  uv_udp_t local_c0;
  
  loop = uv_default_loop();
  iVar1 = uv_udp_init(loop,&local_c0);
  local_178.data = (void *)(long)iVar1;
  local_188._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)local_178.data == (uv_loop_t *)0x0) {
    local_178.data = (uv_loop_t *)0xfffffffffffffff7;
    iVar1 = uv_udp_set_multicast_ttl(&local_c0,0x20);
    local_188._0_8_ = SEXT48(iVar1);
    if (local_178.data != (void *)local_188._0_8_) goto LAB_001dcf56;
    local_178.data = (uv_loop_t *)0xfffffffffffffff7;
    iVar1 = uv_udp_set_broadcast(&local_c0,1);
    local_188._0_8_ = SEXT48(iVar1);
    if (local_178.data != (void *)local_188._0_8_) goto LAB_001dcf63;
    local_178.data = (uv_loop_t *)0xfffffffffffffff7;
    iVar1 = uv_udp_set_ttl(&local_c0,1);
    local_188._0_8_ = SEXT48(iVar1);
    if (local_178.data != (void *)local_188._0_8_) goto LAB_001dcf70;
    local_178.data = (uv_loop_t *)0xfffffffffffffff7;
    iVar1 = uv_udp_set_multicast_loop(&local_c0,1);
    local_188._0_8_ = SEXT48(iVar1);
    if (local_178.data != (void *)local_188._0_8_) goto LAB_001dcf7d;
    local_178.data = (uv_loop_t *)0xfffffffffffffff7;
    iVar1 = uv_udp_set_multicast_interface(&local_c0,"0.0.0.0");
    local_188._0_8_ = SEXT48(iVar1);
    if (local_178.data != (void *)local_188._0_8_) goto LAB_001dcf8a;
    uv_close((uv_handle_t *)&local_c0,(uv_close_cb)0x0);
    iVar1 = uv_udp_init_ex(loop,&local_178,0x102);
    local_188._0_8_ = SEXT48(iVar1);
    local_188._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_188._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcf97;
    iVar1 = uv_udp_set_multicast_ttl(&local_178,0x20);
    local_188._0_8_ = SEXT48(iVar1);
    local_188._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_188._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcfa4;
    iVar1 = uv_udp_set_broadcast(&local_178,1);
    local_188._0_8_ = SEXT48(iVar1);
    local_188._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_188._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcfb1;
    iVar1 = uv_udp_set_ttl(&local_178,1);
    local_188._0_8_ = SEXT48(iVar1);
    local_188._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_188._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcfbe;
    iVar1 = uv_udp_set_multicast_loop(&local_178,1);
    local_188._0_8_ = SEXT48(iVar1);
    local_188._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_188._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcfcb;
    iVar1 = uv_udp_set_multicast_interface(&local_178,"0.0.0.0");
    local_188._0_8_ = SEXT48(iVar1);
    local_188._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_188._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcfd8;
    uv_close((uv_handle_t *)&local_178,(uv_close_cb)0x0);
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    local_188._0_8_ = SEXT48(iVar1);
    local_188._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_188._0_8_ == (uv_loop_t *)0x0) {
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      local_188._0_8_ = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(loop);
      local_188._8_8_ = SEXT48(iVar1);
      if (local_188._0_8_ == local_188._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001dcff2;
    }
  }
  else {
    run_test_udp_no_autobind_cold_1();
LAB_001dcf56:
    run_test_udp_no_autobind_cold_2();
LAB_001dcf63:
    run_test_udp_no_autobind_cold_3();
LAB_001dcf70:
    run_test_udp_no_autobind_cold_4();
LAB_001dcf7d:
    run_test_udp_no_autobind_cold_5();
LAB_001dcf8a:
    run_test_udp_no_autobind_cold_6();
LAB_001dcf97:
    run_test_udp_no_autobind_cold_7();
LAB_001dcfa4:
    run_test_udp_no_autobind_cold_8();
LAB_001dcfb1:
    run_test_udp_no_autobind_cold_9();
LAB_001dcfbe:
    run_test_udp_no_autobind_cold_10();
LAB_001dcfcb:
    run_test_udp_no_autobind_cold_11();
LAB_001dcfd8:
    run_test_udp_no_autobind_cold_12();
  }
  run_test_udp_no_autobind_cold_13();
LAB_001dcff2:
  handle = (uv_handle_t *)local_188;
  run_test_udp_no_autobind_cold_14();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(udp_no_autobind) {
  uv_loop_t* loop;
  uv_udp_t h;
  uv_udp_t h2;

  loop = uv_default_loop();

  /* Test a lazy initialized socket. */
  ASSERT_OK(uv_udp_init(loop, &h));
  ASSERT_EQ(UV_EBADF, uv_udp_set_multicast_ttl(&h, 32));
  ASSERT_EQ(UV_EBADF, uv_udp_set_broadcast(&h, 1));
#if defined(__MVS__)
  ASSERT_EQ(UV_ENOTSUP, uv_udp_set_ttl(&h, 1));
#else
  ASSERT_EQ(UV_EBADF, uv_udp_set_ttl(&h, 1));
#endif
  ASSERT_EQ(UV_EBADF, uv_udp_set_multicast_loop(&h, 1));
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  ASSERT_EQ(UV_EBADF, uv_udp_set_multicast_interface(&h, "0.0.0.0"));

  uv_close((uv_handle_t*) &h, NULL);

  /* Test a non-lazily initialized socket. */
  ASSERT_OK(uv_udp_init_ex(loop, &h2, AF_INET | UV_UDP_RECVMMSG));
  ASSERT_OK(uv_udp_set_multicast_ttl(&h2, 32));
  ASSERT_OK(uv_udp_set_broadcast(&h2, 1));

#if defined(__MVS__)
  /* zOS only supports setting ttl for IPv6 sockets. */
  ASSERT_EQ(UV_ENOTSUP, uv_udp_set_ttl(&h2, 1));
#else
  ASSERT_OK(uv_udp_set_ttl(&h2, 1));
#endif

  ASSERT_OK(uv_udp_set_multicast_loop(&h2, 1));
  ASSERT_OK(uv_udp_set_multicast_interface(&h2, "0.0.0.0"));

  uv_close((uv_handle_t*) &h2, NULL);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}